

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O1

buffer_ptr<duckdb_fsst_decoder_t> duckdb::make_buffer<duckdb_fsst_decoder_t>(void)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  buffer_ptr<duckdb_fsst_decoder_t> bVar1;
  
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x910);
  this->_M_use_count = 1;
  this->_M_weak_count = 1;
  this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_02487b98;
  switchD_0105b559::default(this + 1,0,0x900);
  in_RDI->version = (unsigned_long_long)(this + 1);
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&in_RDI->zeroTerminated = this;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this->_M_use_count = this->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this->_M_use_count = 2;
  }
  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  bVar1.internal.super___shared_ptr<duckdb_fsst_decoder_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  bVar1.internal.super___shared_ptr<duckdb_fsst_decoder_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (buffer_ptr<duckdb_fsst_decoder_t>)
         bVar1.internal.super___shared_ptr<duckdb_fsst_decoder_t,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

buffer_ptr<T> make_buffer(ARGS &&...args) { // NOLINT: mimic std casing
	return make_shared_ptr<T>(std::forward<ARGS>(args)...);
}